

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableRenderTest::genVertexAttribData
          (BuiltinVariableRenderTest *this)

{
  pointer pVVar1;
  pointer puVar2;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,4);
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = 0.5;
  pVVar1->m_data[1] = 0.0;
  pVVar1->m_data[2] = 0.0;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = 0.0;
  pVVar1[1].m_data[1] = 0.5;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[2].m_data[0] = -0.7;
  pVVar1[2].m_data[1] = -0.1;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[3].m_data[0] = -0.1;
  pVVar1[3].m_data[1] = -0.7;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1[3].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,4);
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = 0.0;
  pVVar1->m_data[1] = 0.0;
  pVVar1->m_data[2] = 0.0;
  pVVar1->m_data[3] = 0.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = 1.0;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[2].m_data[0] = 2.0;
  pVVar1[2].m_data[1] = 0.0;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 0.0;
  pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[3].m_data[0] = 3.0;
  pVVar1[3].m_data[1] = 0.0;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1[3].m_data[3] = 0.0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_indices,4);
  puVar2 = (this->super_GeometryShaderRenderTest).m_indices.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2[0] = 3;
  puVar2[1] = 2;
  puVar2[2] = 0xffff;
  puVar2[3] = 1;
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 4;
  return;
}

Assistant:

void BuiltinVariableRenderTest::genVertexAttribData (void)
{
	m_vertexPosData.resize(4);
	m_vertexPosData[0] = tcu::Vec4( 0.5f,  0.0f, 0.0f, 1.0f);
	m_vertexPosData[1] = tcu::Vec4( 0.0f,  0.5f, 0.0f, 1.0f);
	m_vertexPosData[2] = tcu::Vec4(-0.7f, -0.1f, 0.0f, 1.0f);
	m_vertexPosData[3] = tcu::Vec4(-0.1f, -0.7f, 0.0f, 1.0f);

	m_vertexAttrData.resize(4);
	m_vertexAttrData[0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	m_vertexAttrData[1] = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);
	m_vertexAttrData[2] = tcu::Vec4(2.0f, 0.0f, 0.0f, 0.0f);
	m_vertexAttrData[3] = tcu::Vec4(3.0f, 0.0f, 0.0f, 0.0f);

	// Only used by primitive ID restart test
	m_indices.resize(4);
	m_indices[0] = 3;
	m_indices[1] = 2;
	m_indices[2] = 0xFFFF; // restart
	m_indices[3] = 1;

	m_numDrawVertices = 4;
}